

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase184::run(TestCase184 *this)

{
  Own<kj::(anonymous_namespace)::StaticType> *other;
  void *pvVar1;
  void *pvVar2;
  Own<kj::(anonymous_namespace)::SingularDerivedDynamic> *other_00;
  Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> *pOVar3;
  DynamicType2 *pDVar4;
  Own<kj::(anonymous_namespace)::DynamicType2> *other_01;
  bool local_11b;
  bool local_11a;
  bool local_119;
  undefined1 local_118 [5];
  bool _kj_shouldLog_8;
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  Own<void> voidPtr_3;
  bool _kj_shouldLog_5;
  DynamicType2 *baseAddr;
  Own<kj::(anonymous_namespace)::DynamicType2> basePtr;
  MultipleDerivedDynamic *addr_3;
  undefined1 local_d8 [8];
  Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> ptr_3;
  undefined1 local_c0 [4];
  bool destructorCalled_2;
  bool _kj_shouldLog_4;
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  Own<void> voidPtr_2;
  MultipleDerivedDynamic *addr_2;
  undefined1 local_a0 [8];
  Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> ptr_2;
  undefined1 local_88 [6];
  bool destructorCalled_1;
  bool _kj_shouldLog_1;
  Own<void> voidPtr_1;
  SingularDerivedDynamic *addr_1;
  undefined1 local_68 [8];
  Own<kj::(anonymous_namespace)::SingularDerivedDynamic> ptr_1;
  undefined1 local_50 [6];
  bool destructorCalled;
  bool _kj_shouldLog;
  Own<void> voidPtr;
  StaticType *local_30;
  StaticType *addr;
  undefined1 local_20 [8];
  Own<kj::(anonymous_namespace)::StaticType> ptr;
  TestCase184 *this_local;
  
  addr._4_4_ = 0x7b;
  ptr.ptr = (StaticType *)this;
  heap<kj::(anonymous_namespace)::StaticType>((kj *)local_20,(StaticType *)((long)&addr + 4));
  local_30 = Own<kj::(anonymous_namespace)::StaticType>::get
                       ((Own<kj::(anonymous_namespace)::StaticType> *)local_20);
  other = mv<kj::Own<kj::(anonymous_namespace)::StaticType>>
                    ((Own<kj::(anonymous_namespace)::StaticType> *)local_20);
  Own<void>::Own<kj::(anonymous_namespace)::StaticType,void>((Own<void> *)local_50,other);
  pvVar1 = Own<void>::get((Own<void> *)local_50);
  pvVar2 = implicitCast<void*,kj::(anonymous_namespace)::StaticType*&>(&local_30);
  if (pvVar1 != pvVar2) {
    ptr_1.ptr._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)ptr_1.ptr._7_1_ != false) {
      _::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0xbd,ERROR,"\"failed: expected \" \"voidPtr.get() == implicitCast<void*>(addr)\"",
                 (char (*) [60])"failed: expected voidPtr.get() == implicitCast<void*>(addr)");
      ptr_1.ptr._7_1_ = false;
    }
  }
  Own<void>::~Own((Own<void> *)local_50);
  Own<kj::(anonymous_namespace)::StaticType>::~Own
            ((Own<kj::(anonymous_namespace)::StaticType> *)local_20);
  ptr_1.ptr._6_1_ = 0;
  addr_1._4_4_ = 0x7b;
  heap<kj::(anonymous_namespace)::SingularDerivedDynamic,int,bool&>
            ((kj *)local_68,(int *)((long)&addr_1 + 4),(bool *)((long)&ptr_1.ptr + 6));
  voidPtr_1.ptr =
       Own<kj::(anonymous_namespace)::SingularDerivedDynamic>::get
                 ((Own<kj::(anonymous_namespace)::SingularDerivedDynamic> *)local_68);
  other_00 = mv<kj::Own<kj::(anonymous_namespace)::SingularDerivedDynamic>>
                       ((Own<kj::(anonymous_namespace)::SingularDerivedDynamic> *)local_68);
  Own<void>::Own<kj::(anonymous_namespace)::SingularDerivedDynamic,void>
            ((Own<void> *)local_88,other_00);
  pvVar1 = Own<void>::get((Own<void> *)local_88);
  pvVar2 = implicitCast<void*,kj::(anonymous_namespace)::SingularDerivedDynamic*&>
                     ((SingularDerivedDynamic **)&voidPtr_1.ptr);
  if (pvVar1 != pvVar2) {
    ptr_2.ptr._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)ptr_2.ptr._7_1_ != false) {
      _::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0xc5,ERROR,"\"failed: expected \" \"voidPtr.get() == implicitCast<void*>(addr)\"",
                 (char (*) [60])"failed: expected voidPtr.get() == implicitCast<void*>(addr)");
      ptr_2.ptr._7_1_ = false;
    }
  }
  Own<void>::~Own((Own<void> *)local_88);
  Own<kj::(anonymous_namespace)::SingularDerivedDynamic>::~Own
            ((Own<kj::(anonymous_namespace)::SingularDerivedDynamic> *)local_68);
  ptr_2.ptr._6_1_ = 0;
  addr_2._4_4_ = 0x7b;
  addr_2._0_4_ = 0x1c8;
  heap<kj::(anonymous_namespace)::MultipleDerivedDynamic,int,int,bool&>
            ((kj *)local_a0,(int *)((long)&addr_2 + 4),(int *)&addr_2,(bool *)((long)&ptr_2.ptr + 6)
            );
  voidPtr_2.ptr =
       Own<kj::(anonymous_namespace)::MultipleDerivedDynamic>::get
                 ((Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> *)local_a0);
  pOVar3 = mv<kj::Own<kj::(anonymous_namespace)::MultipleDerivedDynamic>>
                     ((Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> *)local_a0);
  Own<void>::Own<kj::(anonymous_namespace)::MultipleDerivedDynamic,void>
            ((Own<void> *)local_c0,pOVar3);
  pvVar1 = Own<void>::get((Own<void> *)local_c0);
  pvVar2 = implicitCast<void*,kj::(anonymous_namespace)::MultipleDerivedDynamic*&>
                     ((MultipleDerivedDynamic **)&voidPtr_2.ptr);
  if (pvVar1 != pvVar2) {
    ptr_3.ptr._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)ptr_3.ptr._7_1_ != false) {
      _::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0xcd,ERROR,"\"failed: expected \" \"voidPtr.get() == implicitCast<void*>(addr)\"",
                 (char (*) [60])"failed: expected voidPtr.get() == implicitCast<void*>(addr)");
      ptr_3.ptr._7_1_ = false;
    }
  }
  if ((ptr_2.ptr._6_1_ & 1) != 0) {
    ptr_3.ptr._6_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)ptr_3.ptr._6_1_ != false) {
      _::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0xcf,ERROR,"\"failed: expected \" \"!destructorCalled\"",
                 (char (*) [35])"failed: expected !destructorCalled");
      ptr_3.ptr._6_1_ = false;
    }
  }
  Own<void>::operator=((Own<void> *)local_c0,(void *)0x0);
  if ((ptr_2.ptr._6_1_ & 1) == 0) {
    ptr_3.ptr._5_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)ptr_3.ptr._5_1_ != false) {
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0xd1,ERROR,"\"failed: expected \" \"destructorCalled\"",
                 (char (*) [34])"failed: expected destructorCalled");
      ptr_3.ptr._5_1_ = false;
    }
  }
  Own<void>::~Own((Own<void> *)local_c0);
  Own<kj::(anonymous_namespace)::MultipleDerivedDynamic>::~Own
            ((Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> *)local_a0);
  ptr_3.ptr._4_1_ = 0;
  addr_3._4_4_ = 0x7b;
  addr_3._0_4_ = 0x1c8;
  heap<kj::(anonymous_namespace)::MultipleDerivedDynamic,int,int,bool&>
            ((kj *)local_d8,(int *)((long)&addr_3 + 4),(int *)&addr_3,(bool *)((long)&ptr_3.ptr + 4)
            );
  basePtr.ptr = (DynamicType2 *)
                Own<kj::(anonymous_namespace)::MultipleDerivedDynamic>::get
                          ((Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> *)local_d8);
  pOVar3 = mv<kj::Own<kj::(anonymous_namespace)::MultipleDerivedDynamic>>
                     ((Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> *)local_d8);
  Own<kj::(anonymous_namespace)::DynamicType2>::
  Own<kj::(anonymous_namespace)::MultipleDerivedDynamic,void>
            ((Own<kj::(anonymous_namespace)::DynamicType2> *)&baseAddr,pOVar3);
  pDVar4 = Own<kj::(anonymous_namespace)::DynamicType2>::get
                     ((Own<kj::(anonymous_namespace)::DynamicType2> *)&baseAddr);
  if (pDVar4 == basePtr.ptr) {
    voidPtr_3.ptr._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)voidPtr_3.ptr._7_1_ != false) {
      _::Debug::log<char_const(&)[74]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0xe3,ERROR,
                 "\"failed: expected \" \"static_cast<void*>(baseAddr) != static_cast<void*>(addr)\""
                 ,(char (*) [74])
                  "failed: expected static_cast<void*>(baseAddr) != static_cast<void*>(addr)");
      voidPtr_3.ptr._7_1_ = false;
    }
  }
  other_01 = mv<kj::Own<kj::(anonymous_namespace)::DynamicType2>>
                       ((Own<kj::(anonymous_namespace)::DynamicType2> *)&baseAddr);
  Own<void>::Own<kj::(anonymous_namespace)::DynamicType2,void>((Own<void> *)local_118,other_01);
  pDVar4 = (DynamicType2 *)Own<void>::get((Own<void> *)local_118);
  if (pDVar4 != basePtr.ptr) {
    local_119 = _::Debug::shouldLog(ERROR);
    while (local_119 != false) {
      _::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0xe6,ERROR,"\"failed: expected \" \"voidPtr.get() == static_cast<void*>(addr)\"",
                 (char (*) [59])"failed: expected voidPtr.get() == static_cast<void*>(addr)");
      local_119 = false;
    }
  }
  if ((ptr_3.ptr._4_1_ & 1) != 0) {
    local_11a = _::Debug::shouldLog(ERROR);
    while (local_11a != false) {
      _::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0xe8,ERROR,"\"failed: expected \" \"!destructorCalled\"",
                 (char (*) [35])"failed: expected !destructorCalled");
      local_11a = false;
    }
  }
  Own<void>::operator=((Own<void> *)local_118,(void *)0x0);
  if ((ptr_3.ptr._4_1_ & 1) == 0) {
    local_11b = _::Debug::shouldLog(ERROR);
    while (local_11b != false) {
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0xea,ERROR,"\"failed: expected \" \"destructorCalled\"",
                 (char (*) [34])"failed: expected destructorCalled");
      local_11b = false;
    }
  }
  Own<void>::~Own((Own<void> *)local_118);
  Own<kj::(anonymous_namespace)::DynamicType2>::~Own
            ((Own<kj::(anonymous_namespace)::DynamicType2> *)&baseAddr);
  Own<kj::(anonymous_namespace)::MultipleDerivedDynamic>::~Own
            ((Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> *)local_d8);
  return;
}

Assistant:

TEST(Memory, OwnVoid) {
  {
    Own<StaticType> ptr = heap<StaticType>({123});
    StaticType* addr = ptr.get();
    Own<void> voidPtr = kj::mv(ptr);
    KJ_EXPECT(voidPtr.get() == implicitCast<void*>(addr));
  }

  {
    bool destructorCalled = false;
    Own<SingularDerivedDynamic> ptr = heap<SingularDerivedDynamic>(123, destructorCalled);
    SingularDerivedDynamic* addr = ptr.get();
    Own<void> voidPtr = kj::mv(ptr);
    KJ_EXPECT(voidPtr.get() == implicitCast<void*>(addr));
  }

  {
    bool destructorCalled = false;
    Own<MultipleDerivedDynamic> ptr = heap<MultipleDerivedDynamic>(123, 456, destructorCalled);
    MultipleDerivedDynamic* addr = ptr.get();
    Own<void> voidPtr = kj::mv(ptr);
    KJ_EXPECT(voidPtr.get() == implicitCast<void*>(addr));

    KJ_EXPECT(!destructorCalled);
    voidPtr = nullptr;
    KJ_EXPECT(destructorCalled);
  }

  {
    bool destructorCalled = false;
    Own<MultipleDerivedDynamic> ptr = heap<MultipleDerivedDynamic>(123, 456, destructorCalled);
    MultipleDerivedDynamic* addr = ptr.get();
    Own<DynamicType2> basePtr = kj::mv(ptr);
    DynamicType2* baseAddr = basePtr.get();

    // On most (all?) C++ ABIs, the second base class in a multiply-inherited class is offset from
    // the beginning of the object (assuming the first base class has non-zero size). We use this
    // fact here to verify that then casting to Own<void> does in fact result in a pointer that
    // points to the start of the overall object, not the base class. We expect that the pointers
    // are different here to prove that the test below is non-trivial.
    //
    // If there is some other ABI where these pointers are the same, and thus this expectation
    // fails, then it's no problem to #ifdef out the expectation on that platform.
    KJ_EXPECT(static_cast<void*>(baseAddr) != static_cast<void*>(addr));

    Own<void> voidPtr = kj::mv(basePtr);
    KJ_EXPECT(voidPtr.get() == static_cast<void*>(addr));

    KJ_EXPECT(!destructorCalled);
    voidPtr = nullptr;
    KJ_EXPECT(destructorCalled);
  }
}